

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-overlay-page.cc
# Opt level: O0

void stamp_page(char *infile,char *stampfile,char *outfile)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  reference pvVar3;
  reference pQVar4;
  ulong uVar5;
  QPDFWriter local_340 [8];
  QPDFWriter w;
  QPDFPageObjectHelper local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  QPDFObjectHandle local_2d8;
  allocator<char> local_2c1;
  string local_2c0 [32];
  QPDFObjectHandle local_2a0;
  allocator<char> local_289;
  string local_288 [32];
  QPDFObjectHandle local_268;
  QPDFObjectHandle local_258;
  QPDFObjectHandle local_248;
  undefined4 local_238;
  undefined4 uStack_230;
  undefined4 local_228;
  undefined4 uStack_220;
  QPDFObjectHandle local_218;
  undefined1 local_208 [8];
  string content;
  QPDFMatrix m;
  allocator<char> local_1b1;
  string local_1b0 [32];
  string local_190 [8];
  string name;
  int min_suffix;
  undefined1 local_148 [8];
  QPDFObjectHandle resources;
  QPDFPageObjectHelper *ph;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_100 [24];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *local_e8;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  undefined1 local_d0 [8];
  QPDFObjectHandle stamp_fo;
  QPDFObjectHandle foreign_fo;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_90 [24];
  undefined1 local_78 [8];
  QPDFPageObjectHelper stamp_page_1;
  QPDF stamppdf;
  QPDF local_28 [8];
  QPDF inpdf;
  char *outfile_local;
  char *stampfile_local;
  char *infile_local;
  
  _inpdf = outfile;
  QPDF::QPDF(local_28);
  QPDF::processFile((char *)local_28,infile);
  QPDF::QPDF((QPDF *)&stamp_page_1.m.
                      super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  QPDF::processFile((char *)&stamp_page_1.m.
                             super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,stampfile);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper
            ((QPDFPageDocumentHelper *)
             &foreign_fo.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (QPDF *)&stamp_page_1.m.
                      super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  QPDFPageDocumentHelper::getAllPages();
  pvVar3 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at(local_90,0);
  QPDFPageObjectHelper::QPDFPageObjectHelper((QPDFPageObjectHelper *)local_78,pvVar3);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_90);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper
            ((QPDFPageDocumentHelper *)
             &foreign_fo.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFPageObjectHelper::getFormXObjectForPage((bool)((char)&stamp_fo + '\b'));
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)&__range1,
             (QPDFObjectHandle *)
             &stamp_fo.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDF::copyForeignObject((QPDFObjectHandle *)local_d0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range1);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1,local_28);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&__begin1);
  local_e8 = local_100;
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_e8)
  ;
  ph = (QPDFPageObjectHelper *)
       std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_e8);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                *)&ph);
    if (!bVar2) break;
    pQVar4 = __gnu_cxx::
             __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
             ::operator*(&__end1);
    resources.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pQVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&min_suffix,"/Resources",
               (allocator<char> *)(name.field_2._M_local_buf + 0xf));
    QPDFPageObjectHelper::getAttribute((string *)local_148,SUB81(pQVar4,0));
    std::__cxx11::string::~string((string *)&min_suffix);
    std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
    name.field_2._8_4_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1b0,"/Fx",&local_1b1);
    QPDFObjectHandle::getUniqueResourceName(local_190,(int *)local_148,(set *)local_1b0);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    QPDFMatrix::QPDFMatrix((QPDFMatrix *)(content.field_2._M_local_buf + 8));
    _Var1 = resources.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    QPDFObjectHandle::QPDFObjectHandle(&local_218,(QPDFObjectHandle *)local_d0);
    QPDFPageObjectHelper::getTrimBox
              (SUB81(&local_248,0),
               SUB81(resources.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,0)
              );
    QPDFObjectHandle::getArrayAsRectangle();
    QPDFPageObjectHelper::placeFormXObject
              (local_208,_Var1._M_pi,&local_218,local_190,(undefined1 *)((long)&content.field_2 + 8)
               ,1,local_238,uStack_230,local_228,uStack_220,1,0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_248);
    QPDFObjectHandle::~QPDFObjectHandle(&local_218);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      operator____qpdf((char *)&local_258,0x106079);
      QPDFObjectHandle::mergeResources((QPDFObjectHandle *)local_148,(map *)&local_258);
      QPDFObjectHandle::~QPDFObjectHandle(&local_258);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_288,"/XObject",&local_289);
      QPDFObjectHandle::getKey((string *)&local_268);
      QPDFObjectHandle::replaceKey((string *)&local_268,(QPDFObjectHandle *)local_190);
      QPDFObjectHandle::~QPDFObjectHandle(&local_268);
      std::__cxx11::string::~string(local_288);
      std::allocator<char>::~allocator(&local_289);
      _Var1 = resources.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2c0,"q\n",&local_2c1);
      QPDF::newStream((string *)&local_2a0);
      QPDFPageObjectHelper::addPageContents((QPDFObjectHandle *)_Var1._M_pi,SUB81(&local_2a0,0));
      QPDFObjectHandle::~QPDFObjectHandle(&local_2a0);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator(&local_2c1);
      _Var1 = resources.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::operator+(&local_2f8,"\nQ\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208)
      ;
      QPDF::newStream((string *)&local_2d8);
      QPDFPageObjectHelper::addPageContents((QPDFObjectHandle *)_Var1._M_pi,SUB81(&local_2d8,0));
      QPDFObjectHandle::~QPDFObjectHandle(&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
    }
    _Var1._M_pi = resources.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_330,(QPDFPageObjectHelper *)local_78);
    QPDFPageObjectHelper::copyAnnotations
              ((QPDFPageObjectHelper *)_Var1._M_pi,(QPDFMatrix *)&local_330,
               (QPDFAcroFormDocumentHelper *)(content.field_2._M_local_buf + 8),
               (QPDFAcroFormDocumentHelper *)0x0);
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_330);
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::string::~string(local_190);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_148);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_100);
  QPDFWriter::QPDFWriter(local_340,local_28,_inpdf);
  QPDFWriter::setStaticID(SUB81(local_340,0));
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_340);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d0);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &stamp_fo.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)local_78);
  QPDF::~QPDF((QPDF *)&stamp_page_1.m.
                       super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
  QPDF::~QPDF(local_28);
  return;
}

Assistant:

static void
stamp_page(char const* infile, char const* stampfile, char const* outfile)
{
    QPDF inpdf;
    inpdf.processFile(infile);
    QPDF stamppdf;
    stamppdf.processFile(stampfile);

    // Get first page from other file
    QPDFPageObjectHelper stamp_page_1 = QPDFPageDocumentHelper(stamppdf).getAllPages().at(0);
    // Convert page to a form XObject
    QPDFObjectHandle foreign_fo = stamp_page_1.getFormXObjectForPage();
    // Copy form XObject to the input file
    QPDFObjectHandle stamp_fo = inpdf.copyForeignObject(foreign_fo);

    // For each page...
    for (auto& ph: QPDFPageDocumentHelper(inpdf).getAllPages()) {
        // Find a unique resource name for the new form XObject
        QPDFObjectHandle resources = ph.getAttribute("/Resources", true);
        int min_suffix = 1;
        std::string name = resources.getUniqueResourceName("/Fx", min_suffix);

        // Generate content to place the form XObject centered within destination page's trim box.
        QPDFMatrix m;
        std::string content =
            ph.placeFormXObject(stamp_fo, name, ph.getTrimBox().getArrayAsRectangle(), m);
        if (!content.empty()) {
            // Append the content to the page's content. Surround the original content with q...Q to
            // the new content from the page's original content.
            resources.mergeResources("<< /XObject << >> >>"_qpdf);
            resources.getKey("/XObject").replaceKey(name, stamp_fo);
            ph.addPageContents(inpdf.newStream("q\n"), true);
            ph.addPageContents(inpdf.newStream("\nQ\n" + content), false);
        }
        // Copy the annotations and form fields from the original page to the new page. For more
        // efficiency when copying multiple pages, we can create a QPDFAcroFormDocumentHelper and
        // pass it in. See comments in QPDFPageObjectHelper.hh for details.
        ph.copyAnnotations(stamp_page_1, m);
    }

    QPDFWriter w(inpdf, outfile);
    w.setStaticID(true); // for testing only
    w.write();
}